

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O2

TPM_RC TPMI_DH_ENTITY_Unmarshal(TPMI_DH_ENTITY *target,BYTE **buffer,INT32 *size,BOOL flag)

{
  uint uVar1;
  TPM_RC TVar2;
  
  TVar2 = UINT32_Unmarshal(target,buffer,size);
  if (TVar2 != 0) {
    return TVar2;
  }
  uVar1 = *target;
  if ((2 < uVar1 + 0xbffffff6) && (uVar1 != 0x40000001)) {
    if (uVar1 == 0x40000007) {
      if (flag == 0) {
        return 0x84;
      }
    }
    else if ((((uVar1 + 0x7e000000 < 0xff000000 && -0x7ffffffe < (int)uVar1) &&
              (uVar1 + 0xbffffef0 < 0xffffff00)) && (0x17 < uVar1)) &&
            ((uVar1 & 0xff000000) != 0x1000000)) {
      return 0x84;
    }
  }
  return 0;
}

Assistant:

TPM_RC
TPMI_DH_ENTITY_Unmarshal(TPMI_DH_ENTITY *target, BYTE **buffer, INT32 *size, BOOL flag)
{
    TPM_RC    result;
    result = TPM_HANDLE_Unmarshal((TPM_HANDLE *)target, buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    switch (*target) {
        case TPM_RH_OWNER:
        case TPM_RH_ENDORSEMENT:
        case TPM_RH_PLATFORM:
        case TPM_RH_LOCKOUT:
            break;
        case TPM_RH_NULL:
        if (flag)
            break;
        return TPM_RC_VALUE;
        default:
            if(((*target < TRANSIENT_FIRST) || (*target > TRANSIENT_LAST))
              &&((*target < PERSISTENT_FIRST) || (*target > PERSISTENT_LAST))
              &&((*target < NV_INDEX_FIRST) || (*target > NV_INDEX_LAST))
              &&(*target > PCR_LAST)
              &&((*target < TPM_RH_AUTH_00) || (*target > TPM_RH_AUTH_FF)))
            return TPM_RC_VALUE;
    }
    return TPM_RC_SUCCESS;
}